

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

int Abc_AigCheck(Abc_Aig_t *pMan)

{
  int *piVar1;
  void **ppvVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  Abc_Ntk_t *pAVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  Abc_Obj_t *pAVar11;
  long lVar12;
  
  pAVar7 = pMan->pNtkAig;
  pVVar5 = pAVar7->vObjs;
  uVar6 = pVVar5->nSize;
  if (0 < (int)uVar6) {
    lVar12 = 0;
    do {
      pAVar11 = (Abc_Obj_t *)pVVar5->pArray[lVar12];
      if ((pAVar11 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar11->field_0x14 & 0xf) == 7)) {
        iVar10 = (pAVar11->vFanins).nSize;
        if (iVar10 == 0) {
          if (**(int **)((ulong)pAVar11 & 0xfffffffffffffffe) != 3) {
            __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                          ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
          }
          if ((*(uint *)((long)((ulong)pAVar11 & 0xfffffffffffffffe) + 0x14) & 0xf) != 1) {
            pcVar3 = "Abc_AigCheck: The AIG has non-standard constant nodes.";
            goto LAB_0083fed3;
          }
        }
        else {
          if (iVar10 == 1) {
            pcVar3 = "Abc_AigCheck: The AIG has single input nodes.";
            goto LAB_0083fed3;
          }
          if (2 < iVar10) {
            pcVar3 = "Abc_AigCheck: The AIG has non-standard nodes.";
            goto LAB_0083fed3;
          }
          piVar1 = (pAVar11->vFanins).pArray;
          ppvVar2 = pAVar11->pNtk->vObjs->pArray;
          uVar9 = *(uint *)((long)ppvVar2[*piVar1] + 0x14) >> 0xc;
          uVar6 = *(uint *)((long)ppvVar2[piVar1[1]] + 0x14) >> 0xc;
          if (uVar6 < uVar9) {
            uVar6 = uVar9;
          }
          if (*(uint *)&pAVar11->field_0x14 >> 0xc != uVar6 + 1) {
            pcVar3 = Abc_ObjName(pAVar11);
            printf("Abc_AigCheck: Node \"%s\" has level that does not agree with the fanin levels.\n"
                   ,pcVar3);
          }
          ppvVar2 = pAVar11->pNtk->vObjs->pArray;
          piVar1 = (pAVar11->vFanins).pArray;
          pAVar4 = Abc_AigAndLookup(pMan,(Abc_Obj_t *)
                                         ((ulong)(*(uint *)&pAVar11->field_0x14 >> 10 & 1) ^
                                         (ulong)ppvVar2[*piVar1]),
                                    (Abc_Obj_t *)
                                    ((ulong)(*(uint *)&pAVar11->field_0x14 >> 0xb & 1) ^
                                    (ulong)ppvVar2[piVar1[1]]));
          if (pAVar4 != pAVar11) {
            pcVar3 = Abc_ObjName(pAVar11);
            printf("Abc_AigCheck: Node \"%s\" is not in the structural hashing table.\n",pcVar3);
          }
        }
      }
      lVar12 = lVar12 + 1;
      pAVar7 = pMan->pNtkAig;
      pVVar5 = pAVar7->vObjs;
      uVar6 = pVVar5->nSize;
    } while (lVar12 < (int)uVar6);
  }
  if ((long)pMan->nBins < 1) {
    iVar10 = 0;
  }
  else {
    lVar12 = 0;
    iVar10 = 0;
    do {
      for (pAVar11 = pMan->pBins[lVar12]; pAVar11 != (Abc_Obj_t *)0x0; pAVar11 = pAVar11->pNext) {
        iVar10 = iVar10 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != pMan->nBins);
  }
  if (iVar10 == pAVar7->nObjCounts[7]) {
    iVar10 = 1;
    if (0 < (int)uVar6) {
      uVar8 = 0;
      do {
        pAVar11 = (Abc_Obj_t *)pVVar5->pArray[uVar8];
        if ((pAVar11 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar11->field_0x14 & 0xf) == 7)) {
          if (((ulong)pAVar11 & 1) != 0) {
            pcVar3 = "!Abc_ObjIsComplement(pNode)";
LAB_0083ff6a:
            __assert_fail(pcVar3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                          ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
          }
          if (pAVar11->pNtk->ntkType != ABC_NTK_STRASH) {
            pcVar3 = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_0083ff6a;
          }
          if (((pAVar11->field_5).pData != (void *)0x0) &&
             (pAVar4 = pAVar11, 0 < (pAVar11->vFanouts).nSize)) {
            while (pAVar4 = (Abc_Obj_t *)(pAVar4->field_5).pData, pAVar4 != (Abc_Obj_t *)0x0) {
              if (0 < (pAVar4->vFanouts).nSize) {
                pcVar3 = Abc_ObjName(pAVar4);
                printf("Abc_AigCheck: Representative %s",pcVar3);
                pcVar3 = Abc_ObjName(pAVar11);
                printf(" of choice node %s has %d fanouts.\n",pcVar3,
                       (ulong)(uint)(pAVar4->vFanouts).nSize);
                return 0;
              }
            }
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar6);
    }
  }
  else {
    pcVar3 = "Abc_AigCheck: The number of nodes in the structural hashing table is wrong.";
LAB_0083fed3:
    puts(pcVar3);
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int Abc_AigCheck( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pObj, * pAnd;
    int i, nFanins, Counter;
    Abc_NtkForEachNode( pMan->pNtkAig, pObj, i )
    {
        nFanins = Abc_ObjFaninNum(pObj);
        if ( nFanins == 0 )
        {
            if ( !Abc_AigNodeIsConst(pObj) )
            {
                printf( "Abc_AigCheck: The AIG has non-standard constant nodes.\n" );
                return 0;
            }
            continue;
        }
        if ( nFanins == 1 )
        {
            printf( "Abc_AigCheck: The AIG has single input nodes.\n" );
            return 0;
        }
        if ( nFanins > 2 )
        {
            printf( "Abc_AigCheck: The AIG has non-standard nodes.\n" );
            return 0;
        }
        if ( pObj->Level != 1 + (unsigned)Abc_MaxInt( Abc_ObjFanin0(pObj)->Level, Abc_ObjFanin1(pObj)->Level ) )
            printf( "Abc_AigCheck: Node \"%s\" has level that does not agree with the fanin levels.\n", Abc_ObjName(pObj) );
        pAnd = Abc_AigAndLookup( pMan, Abc_ObjChild0(pObj), Abc_ObjChild1(pObj) );
        if ( pAnd != pObj )
            printf( "Abc_AigCheck: Node \"%s\" is not in the structural hashing table.\n", Abc_ObjName(pObj) );
    }
    // count the number of nodes in the table
    Counter = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
            Counter++;
    if ( Counter != Abc_NtkNodeNum(pMan->pNtkAig) )
    {
        printf( "Abc_AigCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
    // if the node is a choice node, nodes in its class should not have fanouts
    Abc_NtkForEachNode( pMan->pNtkAig, pObj, i )
        if ( Abc_AigNodeIsChoice(pObj) )
            for ( pAnd = (Abc_Obj_t *)pObj->pData; pAnd; pAnd = (Abc_Obj_t *)pAnd->pData )
                if ( Abc_ObjFanoutNum(pAnd) > 0 )
                {
                    printf( "Abc_AigCheck: Representative %s", Abc_ObjName(pAnd) );
                    printf( " of choice node %s has %d fanouts.\n", Abc_ObjName(pObj), Abc_ObjFanoutNum(pAnd) );
                    return 0;
                }
    return 1;
}